

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_ref(irGenerator *this,LeftVal *dest,LeftVal *src,bool begin)

{
  pointer pcVar1;
  RefInst *pRVar2;
  RefInst *__rhs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined4 uVar3;
  uint32_t uVar4;
  LabelId LVar5;
  Inst *__tmp;
  VarId *__p;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar6;
  string *__p_00;
  RefInst *__p_01;
  undefined7 in_register_00000009;
  shared_ptr<mir::inst::Inst> refInst;
  anon_class_1_0_00000001 local_d9;
  RefInst *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined4 local_b4;
  string local_b0;
  LeftVal local_90;
  shared_ptr<mir::inst::Inst> local_68;
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_68.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_90,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  local_b4 = (undefined4)CONCAT71(in_register_00000009,begin);
  uVar4 = LeftValueToLabelId(this,&local_90);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  __p->id = uVar4;
  local_d8 = (RefInst *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>(a_Stack_d0,__p)
  ;
  pRVar2 = local_d8;
  local_c0 = a_Stack_d0[0]._M_pi;
  local_d8 = (RefInst *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_90.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_d9,&local_90);
  local_90.
  super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  pvVar6 = std::get<1ul,int,std::__cxx11::string>(src);
  pcVar1 = (pvVar6->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + pvVar6->_M_string_length);
  LVar5 = nameToLabelId(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (LVar5 < 0) {
    __p_00 = (string *)operator_new(0x28);
    pvVar6 = std::get<1ul,int,std::__cxx11::string>(src);
    *(string **)__p_00 = __p_00 + 0x10;
    pcVar1 = (pvVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(__p_00,pcVar1,pcVar1 + pvVar6->_M_string_length);
    __p_00[0x20] = (string)0x1;
    local_d8 = (RefInst *)__p_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::variant<mir::inst::VarId,std::__cxx11::string>*>
              (a_Stack_d0,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__p_00);
  }
  else {
    local_d8 = (RefInst *)operator_new(0x28);
    *(undefined ***)local_d8 = &PTR_display_001eb100;
    *(LabelId *)((long)local_d8 + 8) = LVar5;
    *(string *)((long)local_d8 + 0x20) = (string)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::variant<mir::inst::VarId,std::__cxx11::string>*>
              (a_Stack_d0,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d8);
  }
  this_00._M_pi = a_Stack_d0[0]._M_pi;
  __rhs = local_d8;
  __p_01 = (RefInst *)operator_new(0x40);
  uVar4 = *(uint32_t *)((long)pRVar2 + 8);
  std::__detail::__variant::
  _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58,
                    (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__rhs);
  (__p_01->super_Inst).dest.super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001eb100;
  (__p_01->super_Inst).dest.id = uVar4;
  (__p_01->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed168;
  std::__detail::__variant::
  _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__p_01->val,
                    (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58);
  local_d8 = __p_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::RefInst*>
            (a_Stack_d0,__p_01);
  uVar3 = local_b4;
  this_01._M_pi = a_Stack_d0[0]._M_pi;
  local_68.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_Inst;
  local_d8 = (RefInst *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_01._M_pi;
  std::__detail::__variant::
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_58);
  insertInstruction(this,&local_68,SUB41(uVar3,0));
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  return;
}

Assistant:

void irGenerator::ir_ref(LeftVal dest, LeftVal src, bool begin) {
  shared_ptr<VarId> destVarId;
  shared_ptr<std::variant<VarId, std::string>> val;
  LabelId id;
  shared_ptr<mir::inst::Inst> refInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  if ((id = nameToLabelId(get<1>(src))) >= 0) {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(VarId(id)));
  } else {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(get<1>(src)));
  }

  refInst =
      shared_ptr<mir::inst::RefInst>(new mir::inst::RefInst(*destVarId, *val));

  insertInstruction(refInst, begin);
}